

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFImporter.cpp
# Opt level: O3

void __thiscall Assimp::glTFImporter::ImportMaterials(glTFImporter *this,Asset *r)

{
  Material *pMVar1;
  ulong uVar2;
  vector<glTF::Texture_*,_std::allocator<glTF::Texture_*>_> *pvVar3;
  long lVar4;
  long *plVar5;
  undefined8 uVar6;
  aiMaterial **ppaVar7;
  aiMaterial *paVar8;
  aiScene *paVar9;
  int iVar10;
  ulong uVar11;
  char *pcVar12;
  bool bVar13;
  int iVar14;
  size_t sVar15;
  ulong uVar16;
  bool bVar17;
  bool bVar18;
  aiString str;
  aiString local_438;
  
  this->mScene->mNumMaterials =
       (uint)((ulong)((long)(r->materials).mObjs.
                            super__Vector_base<glTF::Material_*,_std::allocator<glTF::Material_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(r->materials).mObjs.
                           super__Vector_base<glTF::Material_*,_std::allocator<glTF::Material_*>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 3);
  paVar9 = this->mScene;
  ppaVar7 = (aiMaterial **)operator_new__((ulong)paVar9->mNumMaterials << 3);
  paVar9->mMaterials = ppaVar7;
  paVar9 = this->mScene;
  if (paVar9->mNumMaterials != 0) {
    uVar16 = 0;
    do {
      paVar8 = (aiMaterial *)operator_new(0x10);
      aiMaterial::aiMaterial(paVar8);
      this->mScene->mMaterials[uVar16] = paVar8;
      pMVar1 = (r->materials).mObjs.
               super__Vector_base<glTF::Material_*,_std::allocator<glTF::Material_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar16];
      uVar2 = (pMVar1->super_Object).id._M_string_length;
      sVar15 = uVar2 & 0xffffffff;
      if ((uVar2 & 0xfffffc00) != 0) {
        sVar15 = 0x3ff;
      }
      local_438.length = (ai_uint32)sVar15;
      memcpy(local_438.data,(pMVar1->super_Object).id._M_dataplus._M_p,sVar15);
      local_438.data[sVar15] = '\0';
      aiMaterial::AddProperty(paVar8,&local_438,"?mat.name",0,0);
      pvVar3 = (pMVar1->ambient).texture.vector;
      if (pvVar3 == (vector<glTF::Texture_*,_std::allocator<glTF::Texture_*>_> *)0x0) {
        local_438._0_8_ = *(undefined8 *)(pMVar1->ambient).color;
        local_438.data._4_8_ = *(undefined8 *)((pMVar1->ambient).color + 2);
        aiMaterial::AddBinaryProperty(paVar8,&local_438,0x10,"$clr.ambient",0,0,aiPTI_Float);
      }
      else {
        lVar4 = *(long *)(*(long *)&pvVar3->
                                    super__Vector_base<glTF::Texture_*,_std::allocator<glTF::Texture_*>_>
                         + (ulong)(pMVar1->ambient).texture.index * 8);
        plVar5 = *(long **)(lVar4 + 0x58);
        if (plVar5 != (long *)0x0) {
          uVar11 = (ulong)*(uint *)(lVar4 + 0x60);
          lVar4 = *(long *)(*plVar5 + uVar11 * 8);
          uVar2 = *(ulong *)(lVar4 + 0x50);
          sVar15 = uVar2 & 0xffffffff;
          if ((uVar2 & 0xfffffc00) != 0) {
            sVar15 = 0x3ff;
          }
          local_438.length = (ai_uint32)sVar15;
          memcpy(local_438.data,*(void **)(lVar4 + 0x48),sVar15);
          uVar6 = local_438._0_8_;
          local_438.data[sVar15] = '\0';
          iVar10 = (this->embeddedTexIdxs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar11];
          if (iVar10 != -1) {
            local_438._0_5_ = 0x2a00000000;
            local_438.length = 1;
            if (iVar10 < 0) {
              local_438.data._2_2_ = SUB82(uVar6,6);
              local_438._0_6_ = 0x2d2a00000000;
              iVar10 = -iVar10;
              local_438.length = 2;
              pcVar12 = local_438.data + 2;
            }
            else {
              pcVar12 = local_438.data + 1;
            }
            iVar14 = 1000000000;
            bVar13 = false;
            do {
              bVar17 = (int)((long)iVar10 / (long)iVar14) != 0;
              bVar18 = iVar14 == 1;
              if ((bVar13 || bVar18) || bVar17) {
                *pcVar12 = (char)((long)iVar10 / (long)iVar14) + '0';
                pcVar12 = pcVar12 + 1;
                local_438.length = local_438.length + 1;
                iVar10 = iVar10 % iVar14;
                if (iVar14 == 1) break;
              }
              iVar14 = iVar14 / 10;
              bVar13 = (bool)(bVar13 | bVar18 | bVar17);
            } while (local_438.length < 0x3ff);
            *pcVar12 = '\0';
          }
          aiMaterial::AddProperty(paVar8,&local_438,"$tex.file",3,0);
        }
      }
      pvVar3 = (pMVar1->diffuse).texture.vector;
      if (pvVar3 == (vector<glTF::Texture_*,_std::allocator<glTF::Texture_*>_> *)0x0) {
        local_438._0_8_ = *(undefined8 *)(pMVar1->diffuse).color;
        local_438.data._4_8_ = *(undefined8 *)((pMVar1->diffuse).color + 2);
        aiMaterial::AddBinaryProperty(paVar8,&local_438,0x10,"$clr.diffuse",0,0,aiPTI_Float);
      }
      else {
        lVar4 = *(long *)(*(long *)&pvVar3->
                                    super__Vector_base<glTF::Texture_*,_std::allocator<glTF::Texture_*>_>
                         + (ulong)(pMVar1->diffuse).texture.index * 8);
        plVar5 = *(long **)(lVar4 + 0x58);
        if (plVar5 != (long *)0x0) {
          uVar11 = (ulong)*(uint *)(lVar4 + 0x60);
          lVar4 = *(long *)(*plVar5 + uVar11 * 8);
          uVar2 = *(ulong *)(lVar4 + 0x50);
          sVar15 = uVar2 & 0xffffffff;
          if ((uVar2 & 0xfffffc00) != 0) {
            sVar15 = 0x3ff;
          }
          local_438.length = (ai_uint32)sVar15;
          memcpy(local_438.data,*(void **)(lVar4 + 0x48),sVar15);
          uVar6 = local_438._0_8_;
          local_438.data[sVar15] = '\0';
          iVar10 = (this->embeddedTexIdxs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar11];
          if (iVar10 != -1) {
            local_438._0_5_ = 0x2a00000000;
            local_438.length = 1;
            if (iVar10 < 0) {
              local_438.data._2_2_ = SUB82(uVar6,6);
              local_438._0_6_ = 0x2d2a00000000;
              iVar10 = -iVar10;
              local_438.length = 2;
              pcVar12 = local_438.data + 2;
            }
            else {
              pcVar12 = local_438.data + 1;
            }
            iVar14 = 1000000000;
            bVar13 = false;
            do {
              bVar17 = (int)((long)iVar10 / (long)iVar14) != 0;
              bVar18 = iVar14 == 1;
              if ((bVar13 || bVar18) || bVar17) {
                *pcVar12 = (char)((long)iVar10 / (long)iVar14) + '0';
                pcVar12 = pcVar12 + 1;
                local_438.length = local_438.length + 1;
                iVar10 = iVar10 % iVar14;
                if (iVar14 == 1) break;
              }
              iVar14 = iVar14 / 10;
              bVar13 = (bool)(bVar13 | bVar18 | bVar17);
            } while (local_438.length < 0x3ff);
            *pcVar12 = '\0';
          }
          aiMaterial::AddProperty(paVar8,&local_438,"$tex.file",1,0);
        }
      }
      pvVar3 = (pMVar1->specular).texture.vector;
      if (pvVar3 == (vector<glTF::Texture_*,_std::allocator<glTF::Texture_*>_> *)0x0) {
        local_438._0_8_ = *(undefined8 *)(pMVar1->specular).color;
        local_438.data._4_8_ = *(undefined8 *)((pMVar1->specular).color + 2);
        aiMaterial::AddBinaryProperty(paVar8,&local_438,0x10,"$clr.specular",0,0,aiPTI_Float);
      }
      else {
        lVar4 = *(long *)(*(long *)&pvVar3->
                                    super__Vector_base<glTF::Texture_*,_std::allocator<glTF::Texture_*>_>
                         + (ulong)(pMVar1->specular).texture.index * 8);
        plVar5 = *(long **)(lVar4 + 0x58);
        if (plVar5 != (long *)0x0) {
          uVar11 = (ulong)*(uint *)(lVar4 + 0x60);
          lVar4 = *(long *)(*plVar5 + uVar11 * 8);
          uVar2 = *(ulong *)(lVar4 + 0x50);
          sVar15 = uVar2 & 0xffffffff;
          if ((uVar2 & 0xfffffc00) != 0) {
            sVar15 = 0x3ff;
          }
          local_438.length = (ai_uint32)sVar15;
          memcpy(local_438.data,*(void **)(lVar4 + 0x48),sVar15);
          uVar6 = local_438._0_8_;
          local_438.data[sVar15] = '\0';
          iVar10 = (this->embeddedTexIdxs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar11];
          if (iVar10 != -1) {
            local_438._0_5_ = 0x2a00000000;
            local_438.length = 1;
            if (iVar10 < 0) {
              local_438.data._2_2_ = SUB82(uVar6,6);
              local_438._0_6_ = 0x2d2a00000000;
              iVar10 = -iVar10;
              local_438.length = 2;
              pcVar12 = local_438.data + 2;
            }
            else {
              pcVar12 = local_438.data + 1;
            }
            iVar14 = 1000000000;
            bVar13 = false;
            do {
              bVar17 = (int)((long)iVar10 / (long)iVar14) != 0;
              bVar18 = iVar14 == 1;
              if ((bVar13 || bVar18) || bVar17) {
                *pcVar12 = (char)((long)iVar10 / (long)iVar14) + '0';
                pcVar12 = pcVar12 + 1;
                local_438.length = local_438.length + 1;
                iVar10 = iVar10 % iVar14;
                if (iVar14 == 1) break;
              }
              iVar14 = iVar14 / 10;
              bVar13 = (bool)(bVar13 | bVar18 | bVar17);
            } while (local_438.length < 0x3ff);
            *pcVar12 = '\0';
          }
          aiMaterial::AddProperty(paVar8,&local_438,"$tex.file",2,0);
        }
      }
      pvVar3 = (pMVar1->emission).texture.vector;
      if (pvVar3 == (vector<glTF::Texture_*,_std::allocator<glTF::Texture_*>_> *)0x0) {
        local_438._0_8_ = *(undefined8 *)(pMVar1->emission).color;
        local_438.data._4_8_ = *(undefined8 *)((pMVar1->emission).color + 2);
        aiMaterial::AddBinaryProperty(paVar8,&local_438,0x10,"$clr.emissive",0,0,aiPTI_Float);
      }
      else {
        lVar4 = *(long *)(*(long *)&pvVar3->
                                    super__Vector_base<glTF::Texture_*,_std::allocator<glTF::Texture_*>_>
                         + (ulong)(pMVar1->emission).texture.index * 8);
        plVar5 = *(long **)(lVar4 + 0x58);
        if (plVar5 != (long *)0x0) {
          uVar11 = (ulong)*(uint *)(lVar4 + 0x60);
          lVar4 = *(long *)(*plVar5 + uVar11 * 8);
          uVar2 = *(ulong *)(lVar4 + 0x50);
          sVar15 = uVar2 & 0xffffffff;
          if ((uVar2 & 0xfffffc00) != 0) {
            sVar15 = 0x3ff;
          }
          local_438.length = (ai_uint32)sVar15;
          memcpy(local_438.data,*(void **)(lVar4 + 0x48),sVar15);
          uVar6 = local_438._0_8_;
          local_438.data[sVar15] = '\0';
          iVar10 = (this->embeddedTexIdxs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar11];
          if (iVar10 != -1) {
            local_438._0_5_ = 0x2a00000000;
            local_438.length = 1;
            if (iVar10 < 0) {
              local_438.data._2_2_ = SUB82(uVar6,6);
              local_438._0_6_ = 0x2d2a00000000;
              iVar10 = -iVar10;
              local_438.length = 2;
              pcVar12 = local_438.data + 2;
            }
            else {
              pcVar12 = local_438.data + 1;
            }
            iVar14 = 1000000000;
            bVar13 = false;
            do {
              bVar17 = (int)((long)iVar10 / (long)iVar14) != 0;
              bVar18 = iVar14 == 1;
              if ((bVar13 || bVar18) || bVar17) {
                *pcVar12 = (char)((long)iVar10 / (long)iVar14) + '0';
                pcVar12 = pcVar12 + 1;
                local_438.length = local_438.length + 1;
                iVar10 = iVar10 % iVar14;
                if (iVar14 == 1) break;
              }
              iVar14 = iVar14 / 10;
              bVar13 = (bool)(bVar13 | bVar18 | bVar17);
            } while (local_438.length < 0x3ff);
            *pcVar12 = '\0';
          }
          aiMaterial::AddProperty(paVar8,&local_438,"$tex.file",4,0);
        }
      }
      aiMaterial::AddBinaryProperty(paVar8,&pMVar1->doubleSided,1,"$mat.twosided",0,0,aiPTI_Buffer);
      if ((pMVar1->transparent == true) &&
         ((pMVar1->transparency != 1.0 || (NAN(pMVar1->transparency))))) {
        aiMaterial::AddBinaryProperty(paVar8,&pMVar1->transparency,4,"$mat.opacity",0,0,aiPTI_Float)
        ;
      }
      if (0.0 < pMVar1->shininess) {
        aiMaterial::AddBinaryProperty(paVar8,&pMVar1->shininess,4,"$mat.shininess",0,0,aiPTI_Float);
      }
      uVar16 = uVar16 + 1;
      paVar9 = this->mScene;
    } while (uVar16 < paVar9->mNumMaterials);
    if (paVar9->mNumMaterials != 0) {
      return;
    }
  }
  paVar9->mNumMaterials = 1;
  ppaVar7 = (aiMaterial **)operator_new__(8);
  this->mScene->mMaterials = ppaVar7;
  paVar8 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(paVar8);
  *this->mScene->mMaterials = paVar8;
  return;
}

Assistant:

void glTFImporter::ImportMaterials(glTF::Asset& r) {
    mScene->mNumMaterials = unsigned(r.materials.Size());
    mScene->mMaterials = new aiMaterial*[mScene->mNumMaterials];

    for (unsigned int i = 0; i < mScene->mNumMaterials; ++i) {
        aiMaterial* aimat = mScene->mMaterials[i] = new aiMaterial();

        Material& mat = r.materials[i];

        /*if (!mat.name.empty())*/ {
            aiString str(mat.id /*mat.name*/);
            aimat->AddProperty(&str, AI_MATKEY_NAME);
        }

        SetMaterialColorProperty(embeddedTexIdxs, r, mat.ambient,  aimat, aiTextureType_AMBIENT,  AI_MATKEY_COLOR_AMBIENT );
        SetMaterialColorProperty(embeddedTexIdxs, r, mat.diffuse,  aimat, aiTextureType_DIFFUSE,  AI_MATKEY_COLOR_DIFFUSE );
        SetMaterialColorProperty(embeddedTexIdxs, r, mat.specular, aimat, aiTextureType_SPECULAR, AI_MATKEY_COLOR_SPECULAR);
        SetMaterialColorProperty(embeddedTexIdxs, r, mat.emission, aimat, aiTextureType_EMISSIVE, AI_MATKEY_COLOR_EMISSIVE);

        aimat->AddProperty(&mat.doubleSided, 1, AI_MATKEY_TWOSIDED);

        if (mat.transparent && (mat.transparency != 1.0f)) {
            aimat->AddProperty(&mat.transparency, 1, AI_MATKEY_OPACITY);
        }

        if (mat.shininess > 0.f) {
            aimat->AddProperty(&mat.shininess, 1, AI_MATKEY_SHININESS);
        }
    }

    if (mScene->mNumMaterials == 0) {
        mScene->mNumMaterials = 1;
        mScene->mMaterials = new aiMaterial*[1];
        mScene->mMaterials[0] = new aiMaterial();
    }
}